

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void finish_pass1(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_color_quantizer *pjVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  boxptr boxp_00;
  ulong uVar5;
  long lVar6;
  boxptr pbVar7;
  long lVar8;
  boxptr boxp;
  long lVar9;
  int iVar10;
  int iVar11;
  boxptr which;
  boxptr boxp_01;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  char cVar20;
  ulong uVar21;
  int iVar22;
  
  pjVar2 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar2[1].start_pass;
  uVar1 = *(uint *)&pjVar2[1].color_quantize;
  uVar19 = (ulong)(int)uVar1;
  uVar21 = 1;
  boxp_00 = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,uVar19 * 0x28);
  boxp_00->c0min = 0;
  boxp_00->c0max = 0x1f;
  boxp_00->c1min = 0;
  boxp_00->c1max = 0x3f;
  boxp_00->c2min = 0;
  boxp_00->c2max = 0x1f;
  update_box(cinfo,boxp_00);
  if (1 < (long)uVar19) {
    uVar21 = 1;
    do {
      if (uVar19 < uVar21 * 2) {
        boxp_01 = (boxptr)0x0;
        lVar12 = 0;
        uVar5 = uVar21;
        pbVar7 = boxp_00;
        do {
          if (lVar12 < pbVar7->volume) {
            boxp_01 = pbVar7;
            lVar12 = pbVar7->volume;
          }
          pbVar7 = pbVar7 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      else {
        boxp_01 = (boxptr)0x0;
        lVar12 = 0;
        uVar5 = uVar21;
        pbVar7 = boxp_00;
        do {
          if ((lVar12 < pbVar7->colorcount) && (0 < pbVar7->volume)) {
            lVar12 = pbVar7->colorcount;
            boxp_01 = pbVar7;
          }
          pbVar7 = pbVar7 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      if (boxp_01 == (boxptr)0x0) goto LAB_00127c46;
      boxp_00[uVar21].c2max = boxp_01->c2max;
      iVar10 = boxp_01->c0max;
      iVar11 = boxp_01->c1min;
      iVar17 = boxp_01->c1max;
      pbVar7 = boxp_00 + uVar21;
      pbVar7->c0min = boxp_01->c0min;
      pbVar7->c0max = iVar10;
      pbVar7->c1min = iVar11;
      pbVar7->c1max = iVar17;
      boxp_00[uVar21].c2min = boxp_01->c2min;
      uVar5 = (ulong)cinfo->out_color_space;
      iVar10 = (boxp_01->c1max - boxp_01->c1min) * c_scales[rgb_green[uVar5]];
      iVar17 = (boxp_01->c0max - boxp_01->c0min) * c_scales[rgb_red[uVar5]] * 8;
      iVar11 = iVar10 * 4;
      iVar22 = (boxp_01->c2max - boxp_01->c2min) * c_scales[rgb_blue[uVar5]] * 8;
      if ((0x10c4UL >> (uVar5 & 0x3f) & 1) == 0) {
        iVar4 = iVar11;
        if (iVar22 != iVar11 && SBORROW4(iVar22,iVar11) == iVar22 + iVar10 * -4 < 0) {
          iVar4 = iVar22;
        }
        cVar20 = (iVar11 < iVar22) + '\x01';
        if (iVar4 < iVar17) {
          cVar20 = '\0';
        }
      }
      else {
        iVar4 = iVar11;
        if (iVar11 < iVar17) {
          iVar4 = iVar17;
        }
        cVar20 = iVar17 == iVar11 || SBORROW4(iVar17,iVar11) != iVar17 + iVar10 * -4 < 0;
        if (iVar4 < iVar22) {
          cVar20 = '\x02';
        }
      }
      if (cVar20 == '\x02') {
        piVar18 = &boxp_01->c2max;
        lVar12 = uVar21 * 0x28 + 0x10;
        iVar10 = boxp_01->c2min + boxp_01->c2max;
LAB_00127bfa:
        pbVar7 = (boxptr)((long)&boxp_00->c0min + lVar12);
      }
      else {
        if (cVar20 == '\x01') {
          piVar18 = &boxp_01->c1max;
          lVar12 = uVar21 * 0x28 + 8;
          iVar10 = boxp_01->c1min + boxp_01->c1max;
          goto LAB_00127bfa;
        }
        piVar18 = &boxp_01->c0max;
        iVar10 = boxp_01->c0min + boxp_01->c0max;
        pbVar7 = boxp_00 + uVar21;
      }
      *piVar18 = iVar10 / 2;
      pbVar7->c0min = iVar10 / 2 + 1;
      update_box(cinfo,boxp_01);
      update_box(cinfo,boxp_00 + uVar21);
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar19);
    uVar21 = (ulong)uVar1;
  }
LAB_00127c46:
  iVar10 = (int)uVar21;
  if (0 < iVar10) {
    uVar19 = 0;
    do {
      lVar12 = (long)boxp_00[uVar19].c0min;
      if (boxp_00[uVar19].c0max < boxp_00[uVar19].c0min) {
        lVar15 = 0;
        lVar6 = 0;
        lVar8 = 0;
        lVar16 = 0;
      }
      else {
        iVar11 = boxp_00[uVar19].c2min;
        iVar17 = boxp_00[uVar19].c1min;
        lVar16 = 0;
        lVar8 = 0;
        lVar6 = 0;
        lVar15 = 0;
        do {
          if (iVar17 <= boxp_00[uVar19].c1max) {
            lVar14 = *(long *)(cinfo->cquantize[1].finish_pass + lVar12 * 8) +
                     (long)iVar17 * 0x40 + (long)iVar11 * 2;
            lVar13 = (long)iVar17;
            do {
              if (iVar11 <= boxp_00[uVar19].c2max) {
                lVar9 = 0;
                iVar22 = iVar11 * 8 + 4;
                do {
                  uVar5 = (ulong)*(ushort *)(lVar14 + lVar9 * 2);
                  if (uVar5 != 0) {
                    lVar15 = lVar15 + uVar5;
                    lVar6 = lVar6 + uVar5 * (long)((int)lVar12 * 8 + 4);
                    lVar8 = lVar8 + uVar5 * (long)((int)lVar13 * 4 + 2);
                    lVar16 = lVar16 + (long)iVar22 * uVar5;
                  }
                  lVar9 = lVar9 + 1;
                  iVar22 = iVar22 + 8;
                } while ((boxp_00[uVar19].c2max - iVar11) + 1 != (int)lVar9);
              }
              lVar13 = lVar13 + 1;
              lVar14 = lVar14 + 0x40;
            } while (boxp_00[uVar19].c1max + 1 != (int)lVar13);
          }
          lVar12 = lVar12 + 1;
        } while (boxp_00[uVar19].c0max + 1 != (int)lVar12);
      }
      lVar12 = lVar15 >> 1;
      (*cinfo->colormap)[uVar19] = (JSAMPLE)((lVar6 + lVar12) / lVar15);
      cinfo->colormap[1][uVar19] = (JSAMPLE)((lVar8 + lVar12) / lVar15);
      cinfo->colormap[2][uVar19] = (JSAMPLE)((lVar12 + lVar16) / lVar15);
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar21 & 0xffffffff));
  }
  cinfo->actual_number_of_colors = iVar10;
  pjVar3 = cinfo->err;
  pjVar3->msg_code = 0x60;
  (pjVar3->msg_parm).i[0] = iVar10;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  *(undefined4 *)&pjVar2[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}